

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O3

int expansion_sum_zeroelim1(int elen,double *e,int flen,double *f,double *h)

{
  int iVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  
  dVar8 = *f;
  if (elen < 1) {
    elen = 0;
  }
  else {
    uVar6 = 0;
    dVar9 = dVar8;
    do {
      dVar8 = dVar9 + e[uVar6];
      h[uVar6] = (dVar9 - (dVar8 - (dVar8 - dVar9))) + (e[uVar6] - (dVar8 - dVar9));
      uVar6 = uVar6 + 1;
      dVar9 = dVar8;
    } while ((uint)elen != uVar6);
  }
  uVar6 = (ulong)(uint)elen;
  h[uVar6] = dVar8;
  if (1 < flen) {
    uVar4 = 1;
    uVar5 = 0;
    do {
      dVar8 = f[uVar4];
      uVar7 = uVar5;
      dVar9 = dVar8;
      if (uVar4 <= uVar6) {
        do {
          dVar8 = dVar9 + h[uVar7 + 1];
          h[uVar7 + 1] = (dVar9 - (dVar8 - (dVar8 - dVar9))) + (h[uVar7 + 1] - (dVar8 - dVar9));
          uVar7 = uVar7 + 1;
          dVar9 = dVar8;
        } while (uVar7 < uVar6);
      }
      h[uVar6 + 1] = dVar8;
      uVar6 = uVar6 + 1;
      uVar4 = uVar4 + 1;
      uVar5 = uVar5 + 1;
    } while (uVar4 != (uint)flen);
    elen = (int)uVar6;
  }
  iVar2 = -1;
  uVar6 = 0;
  do {
    dVar8 = h[uVar6];
    if ((dVar8 != 0.0) || (NAN(dVar8))) {
      lVar3 = (long)iVar2;
      iVar2 = iVar2 + 1;
      h[lVar3 + 1] = dVar8;
    }
    uVar6 = uVar6 + 1;
  } while (elen + 1 != uVar6);
  iVar1 = 1;
  if (iVar2 + 1 != 0) {
    iVar1 = iVar2 + 1;
  }
  return iVar1;
}

Assistant:

int expansion_sum_zeroelim1(int elen, REAL *e, int flen, REAL *f, REAL *h)
/* e and h can be the same, but f and h cannot. */
{
  REAL Q;
  INEXACT REAL Qnew;
  int index, findex, hindex, hlast;
  REAL hnow;
  INEXACT REAL bvirt;
  REAL avirt, bround, around;

  Q = f[0];
  for (hindex = 0; hindex < elen; hindex++) {
    hnow = e[hindex];
    Two_Sum(Q, hnow, Qnew, h[hindex]);
    Q = Qnew;
  }
  h[hindex] = Q;
  hlast = hindex;
  for (findex = 1; findex < flen; findex++) {
    Q = f[findex];
    for (hindex = findex; hindex <= hlast; hindex++) {
      hnow = h[hindex];
      Two_Sum(Q, hnow, Qnew, h[hindex]);
      Q = Qnew;
    }
    h[++hlast] = Q;
  }
  hindex = -1;
  for (index = 0; index <= hlast; index++) {
    hnow = h[index];
    if (hnow != 0.0) {
      h[++hindex] = hnow;
    }
  }
  if (hindex == -1) {
    return 1;
  } else {
    return hindex + 1;
  }
}